

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuilderClearCode
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  
  bVar1 = HasHasbit(this->descriptor_);
  if (bVar1) {
    PrintNestedBuilderCondition(this,printer,"$name$_ = null;\n","$name$Builder_.clear();\n");
    io::Printer::Print(printer,&this->variables_,"$clear_has_field_bit_builder$\n");
    return;
  }
  PrintNestedBuilderCondition
            (this,printer,"$name$_ = null;\n","$name$_ = null;\n$name$Builder_ = null;\n");
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::GenerateBuilderClearCode(
    io::Printer* printer) const {
  if (HasHasbit(descriptor_)) {
    PrintNestedBuilderCondition(printer, "$name$_ = null;\n",

                                "$name$Builder_.clear();\n");
    printer->Print(variables_, "$clear_has_field_bit_builder$\n");
  } else {
    PrintNestedBuilderCondition(printer, "$name$_ = null;\n",

                                "$name$_ = null;\n"
                                "$name$Builder_ = null;\n");
  }
}